

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInNetworks
          (Registry *this,StringArray *aAliases,StringArray *aUnresolved)

{
  pointer pbVar1;
  pointer pNVar2;
  pointer pBVar3;
  __type _Var4;
  Status SVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  pointer pBVar11;
  pointer pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  pointer __lhs;
  StringArray *__range2;
  NetworkArray nwks;
  BorderRouterArray brs;
  Network current;
  BorderRouter br;
  
  nwks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nwks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nwks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Network::Network(&current);
  pbVar1 = (aAliases->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (aAliases->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
    _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
    if (_Var4) {
      SVar5 = kRestricted;
      goto LAB_00181d18;
    }
    _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(anonymous_namespace)::ALIAS_ALL_abi_cxx11_);
    SVar5 = kDataInvalid;
    if ((_Var4) ||
       ((_Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_), _Var4 &&
        (0x20 < (ulong)((long)(aAliases->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(aAliases->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start))))) goto LAB_00181d18;
  }
  SVar5 = GetNetworksByAliases(this,aAliases,&nwks,aUnresolved);
  if ((SVar5 != kSuccess) ||
     ((bVar6 = std::operator!=((aAliases->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (anonymous_namespace)::ALIAS_OTHER_abi_cxx11_), bVar6 &&
      (SVar5 = GetCurrentNetwork(this,&current), SVar5 != kSuccess)))) goto LAB_00181d18;
  pNVar2 = nwks.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (current.mId.mId != 0xffffffff) {
    lVar10 = (long)nwks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)nwks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pNVar12 = nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar9 = lVar10 / 0x60 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
      if ((pNVar12->mId).mId == current.mId.mId) goto LAB_00181d88;
      if (pNVar12[1].mId.mId == current.mId.mId) {
        pNVar12 = pNVar12 + 1;
        goto LAB_00181d88;
      }
      if (pNVar12[2].mId.mId == current.mId.mId) {
        pNVar12 = pNVar12 + 2;
        goto LAB_00181d88;
      }
      if (pNVar12[3].mId.mId == current.mId.mId) {
        pNVar12 = pNVar12 + 3;
        goto LAB_00181d88;
      }
      pNVar12 = pNVar12 + 4;
      lVar10 = lVar10 + -0x180;
    }
    lVar10 = lVar10 / 0x60;
    if (lVar10 == 1) {
LAB_00181d6a:
      if ((pNVar12->mId).mId != current.mId.mId) {
        pNVar12 = nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar10 == 2) {
LAB_00181d62:
      if ((pNVar12->mId).mId != current.mId.mId) {
        pNVar12 = pNVar12 + 1;
        goto LAB_00181d6a;
      }
    }
    else {
      if (lVar10 != 3) goto LAB_00181d90;
      if ((pNVar12->mId).mId != current.mId.mId) {
        pNVar12 = pNVar12 + 1;
        goto LAB_00181d62;
      }
    }
LAB_00181d88:
    SVar5 = kRestricted;
    if (pNVar12 !=
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00181d18;
  }
LAB_00181d90:
  SVar5 = kSuccess;
  pNVar12 = nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pNVar12 == pNVar2) break;
    brs.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    brs.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    brs.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BorderRouter::BorderRouter(&br);
    br.mNetworkId.mId = (pNVar12->mId).mId;
    iVar8 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&br,&brs);
    pBVar3 = brs.
             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    cVar7 = (char)iVar8;
    SVar5 = (cVar7 != '\0') << 2;
    if (cVar7 == '\x01') {
      SVar5 = kNotFound;
    }
    pBVar11 = brs.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (cVar7 == '\0') {
      do {
        if (pBVar11 == pBVar3) {
          SVar5 = DropDomainIfEmpty(this,&pNVar12->mDomainId);
          bVar6 = SVar5 == kSuccess;
          goto LAB_00181e65;
        }
        SVar5 = DeleteBorderRouterById(this,&pBVar11->mId);
        pBVar11 = pBVar11 + 1;
      } while (SVar5 == kSuccess);
      bVar6 = false;
    }
    else {
      bVar6 = false;
    }
LAB_00181e65:
    BorderRouter::~BorderRouter(&br);
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::~vector(&brs);
    pNVar12 = pNVar12 + 1;
  } while (bVar6);
LAB_00181d18:
  Network::~Network(&current);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&nwks);
  return SVar5;
}

Assistant:

Registry::Status Registry::DeleteBorderRoutersInNetworks(const StringArray &aAliases, StringArray &aUnresolved)
{
    Registry::Status status;
    NetworkArray     nwks;
    Network          current;

    // Check aAliases acceptable
    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_THIS)
        {
            return Registry::Status::kRestricted;
        }
        if (alias == ALIAS_ALL || (alias == ALIAS_OTHER && aAliases.size() > 1))
        {
            return Registry::Status::kDataInvalid;
        }
    }

    VerifyOrExit((status = GetNetworksByAliases(aAliases, nwks, aUnresolved)) == Registry::Status::kSuccess);

    // Processing explicit network aAliases
    if (aAliases[0] != ALIAS_OTHER)
    {
        VerifyOrExit((status = GetCurrentNetwork(current)) == Registry::Status::kSuccess);
    }

    if (current.mId.mId != EMPTY_ID)
    {
        auto found =
            std::find_if(nwks.begin(), nwks.end(), [&](const Network &a) { return a.mId.mId == current.mId.mId; });
        VerifyOrExit(found == nwks.end(), status = Registry::Status::kRestricted);
    }

    for (const auto &nwk : nwks)
    {
        BorderRouterArray brs;
        BorderRouter      br;

        br.mNetworkId = nwk.mId;
        VerifyOrExit((status = MapStatus(mStorage->Lookup(br, brs))) == Registry::Status::kSuccess);
        for (auto &&br : brs)
        {
            VerifyOrExit((status = DeleteBorderRouterById(br.mId)) == Registry::Status::kSuccess);
        }

        VerifyOrExit((status = DropDomainIfEmpty(nwk.mDomainId)) == Registry::Status::kSuccess);
    }
exit:
    return status;
}